

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float **ppfVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  int k;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int *piVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  double dVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [64];
  undefined8 in_XMM3_Qb;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_b1;
  int *local_b0;
  ulong local_a8;
  double local_a0;
  long local_98;
  ulong local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  long local_70;
  ulong local_68;
  vector<float,_std::allocator<float>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar15 = (ulong)(uint)count;
  local_b0 = scaleBufferIndices;
  local_88 = bufferIndices;
  local_80 = categoryWeightsIndices;
  local_78 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  std::vector<float,_std::allocator<float>_>::vector(&local_60,(long)this->kPatternCount,&local_b1);
  piVar18 = local_b0;
  local_90 = uVar15;
  if (0 < count) {
    local_68 = (ulong)(count - 1);
    uVar14 = 0;
    local_a0 = (double)uVar15;
    do {
      local_70 = (long)local_88[uVar14];
      pfVar10 = this->gPartials[local_70];
      pfVar3 = this->gStateFrequencies[local_78[uVar14]];
      pfVar4 = this->gCategoryWeights[local_80[uVar14]];
      iVar20 = this->kPatternCount;
      iVar13 = 0;
      if (0 < iVar20) {
        iVar2 = this->kStateCount;
        pfVar5 = this->integrationTmp;
        iVar16 = 0;
        iVar13 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar2) {
            iVar19 = 0;
            lVar11 = 0;
            do {
              *(float *)((long)pfVar5 + lVar11 + (long)iVar17 * 4) =
                   *(float *)((long)pfVar10 + lVar11 + (long)iVar13 * 4) * *pfVar4;
              lVar11 = lVar11 + 4;
              iVar19 = iVar19 + -1;
            } while (-iVar2 != iVar19);
            iVar17 = iVar17 - iVar19;
            iVar13 = iVar13 - iVar19;
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != iVar20);
      }
      local_98 = (long)this->kCategoryCount;
      if (1 < local_98) {
        iVar2 = this->kStateCount;
        lVar11 = 1;
        do {
          if (0 < iVar20) {
            pfVar5 = this->integrationTmp;
            iVar16 = 0;
            iVar17 = 0;
            do {
              if (0 < iVar2) {
                iVar19 = 0;
                lVar12 = 0;
                do {
                  auVar8 = vfmadd213ss_fma(ZEXT416((uint)pfVar4[lVar11]),
                                           ZEXT416(*(uint *)((long)pfVar10 +
                                                            lVar12 + (long)iVar13 * 4)),
                                           ZEXT416(*(uint *)((long)pfVar5 +
                                                            lVar12 + (long)iVar17 * 4)));
                  *(int *)((long)pfVar5 + lVar12 + (long)iVar17 * 4) = auVar8._0_4_;
                  lVar12 = lVar12 + 4;
                  iVar19 = iVar19 + -1;
                } while (-iVar2 != iVar19);
                iVar17 = iVar17 - iVar19;
                iVar13 = iVar13 - iVar19;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 != iVar20);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_98);
      }
      piVar18 = local_b0;
      local_a8 = uVar14;
      if (0 < this->kPatternCount) {
        lVar11 = 0;
        iVar20 = 0;
        do {
          iVar13 = this->kStateCount;
          if ((long)iVar13 < 1) {
            auVar25 = ZEXT864(0);
          }
          else {
            auVar25 = ZEXT864(0);
            lVar12 = 0;
            do {
              auVar8 = vfmadd231ss_fma(auVar25._0_16_,ZEXT416((uint)pfVar3[lVar12]),
                                       ZEXT416((uint)this->integrationTmp[iVar20 + lVar12]));
              auVar25 = ZEXT1664(auVar8);
              lVar12 = lVar12 + 1;
            } while (iVar13 != lVar12);
            iVar20 = iVar20 + iVar13;
          }
          fVar24 = auVar25._0_4_;
          if ((*piVar18 != -1) || ((this->kFlags & 0x100) != 0)) {
            uVar9 = (uint)this->kFlags;
            if ((uVar9 >> 8 & 1) == 0) {
              iVar13 = piVar18[uVar14];
            }
            else {
              iVar13 = (int)local_70 - this->kTipCount;
            }
            ppfVar6 = this->gScaleBuffers;
            pfVar10 = ppfVar6[iVar13];
            if (uVar14 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar11] = 0;
              local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] = pfVar10[lVar11];
              if ((int)local_90 != 1) {
                fVar21 = local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
                uVar15 = 1;
                do {
                  if ((uVar9 >> 8 & 1) == 0) {
                    iVar13 = piVar18[uVar15];
                  }
                  else {
                    iVar13 = local_88[uVar15] - this->kTipCount;
                  }
                  fVar1 = ppfVar6[iVar13][lVar11];
                  if (fVar21 < fVar1) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11] = (int)uVar15;
                    local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11] = fVar1;
                    fVar21 = fVar1;
                  }
                  uVar15 = uVar15 + 1;
                } while (local_a0 != (double)uVar15);
              }
            }
            uVar14 = local_a8;
            if (local_a8 !=
                (uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar11]) {
              local_98 = CONCAT44(local_98._4_4_,fVar24);
              dVar22 = exp((double)(pfVar10[lVar11] -
                                   local_60.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar11]));
              fVar24 = (float)(dVar22 * (double)(float)local_98);
              uVar14 = local_a8;
              piVar18 = local_b0;
            }
          }
          if (uVar14 == 0) {
            this->outLogLikelihoodsTmp[lVar11] = fVar24;
          }
          else {
            if (uVar14 == local_68) {
              dVar22 = log((double)(fVar24 + this->outLogLikelihoodsTmp[lVar11]));
              fVar24 = (float)dVar22;
              pfVar10 = this->outLogLikelihoodsTmp;
              uVar14 = local_a8;
              piVar18 = local_b0;
            }
            else {
              pfVar10 = this->outLogLikelihoodsTmp;
              fVar24 = fVar24 + pfVar10[lVar11];
            }
            pfVar10[lVar11] = fVar24;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < this->kPatternCount);
      }
      uVar14 = uVar14 + 1;
    } while ((double)uVar14 != local_a0);
  }
  if (((*piVar18 != -1) || ((this->kFlags & 0x100) != 0)) &&
     (iVar20 = this->kPatternCount, 0 < (long)iVar20)) {
    pfVar10 = this->outLogLikelihoodsTmp;
    lVar11 = 0;
    do {
      pfVar10[lVar11] =
           local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11] + pfVar10[lVar11];
      lVar11 = lVar11 + 1;
    } while (iVar20 != lVar11);
  }
  *outSumLogLikelihood = 0.0;
  iVar20 = this->kPatternCount;
  if (0 < (long)iVar20) {
    pdVar7 = this->gPatternWeights;
    pfVar10 = this->outLogLikelihoodsTmp;
    auVar25 = ZEXT864((ulong)*outSumLogLikelihood);
    lVar11 = 0;
    do {
      auVar23._0_8_ = (double)pfVar10[lVar11];
      auVar23._8_8_ = in_XMM3_Qb;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = pdVar7[lVar11];
      auVar8 = vfmadd231sd_fma(auVar25._0_16_,auVar23,auVar8);
      auVar25 = ZEXT1664(auVar8);
      *outSumLogLikelihood = auVar8._0_8_;
      lVar11 = lVar11 + 1;
    } while (iVar20 != lVar11);
  }
  local_a0 = *outSumLogLikelihood;
  if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (uint)(!NAN(local_a0) && !NAN(local_a0)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}